

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_input_mouse_clicked(nk_input *i,nk_buttons id,nk_rect rect)

{
  nk_bool nVar1;
  
  if (i != (nk_input *)0x0) {
    nVar1 = nk_input_is_mouse_hovering_rect(i,rect);
    if (nVar1 != 0) {
      nVar1 = nk_input_is_mouse_click_in_rect(i,id,rect);
      return nVar1;
    }
  }
  return 0;
}

Assistant:

NK_API nk_bool
nk_input_mouse_clicked(const struct nk_input *i, enum nk_buttons id, struct nk_rect rect)
{
if (!i) return nk_false;
if (!nk_input_is_mouse_hovering_rect(i, rect)) return nk_false;
return nk_input_is_mouse_click_in_rect(i, id, rect);
}